

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::writeSequentialContainer<QList<long_long>>(QDataStream *s,QList<long_long> *c)

{
  bool bVar1;
  const_iterator o;
  longlong *plVar2;
  QList<long_long> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  value_type_conflict6 *t;
  QList<long_long> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  QDataStream *in_stack_ffffffffffffffa8;
  QDataStream *this;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QList<long_long>::size(in_RSI);
  bVar1 = QDataStream::writeQSizeType(in_stack_ffffffffffffffa8,0x206ab1);
  if (bVar1) {
    local_10.i = (longlong *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<long_long>::begin((QList<long_long> *)this);
    o = QList<long_long>::end((QList<long_long> *)this);
    while (bVar1 = QList<long_long>::const_iterator::operator!=(&local_10,o), bVar1) {
      plVar2 = QList<long_long>::const_iterator::operator*(&local_10);
      QDataStream::operator<<(in_RDI,*plVar2);
      QList<long_long>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}